

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

void Aig_ManStop(Aig_Man_t *p)

{
  void *pvVar1;
  void **ppvVar2;
  int *piVar3;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  int level;
  Aig_Man_t *pAVar8;
  
  pAVar8 = p;
  if (p->time1 != 0) {
    Abc_Print((int)p,"%s =","time1");
    Abc_Print((int)pAVar8,"%9.2f sec\n",(double)p->time1 / 1000000.0);
  }
  level = (int)pAVar8;
  if (p->time2 != 0) {
    Abc_Print(level,"%s =","time2");
    Abc_Print(level,"%9.2f sec\n",(double)p->time2 / 1000000.0);
  }
  lVar6 = (long)p->vObjs->nSize;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 0x18) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMan.c"
                      ,0xc3,"void Aig_ManStop(Aig_Man_t *)");
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  Tim_ManStopP((Tim_Man_t **)&p->pManTime);
  if (p->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p);
  }
  if (p->pManExdc != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pManExdc);
  }
  Aig_MmFixedStop(p->pMemObjs,0);
  if (p->vCis != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vCis->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vCis->pArray = (void **)0x0;
    }
    if (p->vCis != (Vec_Ptr_t *)0x0) {
      free(p->vCis);
      p->vCis = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vCos != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vCos->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vCos->pArray = (void **)0x0;
    }
    if (p->vCos != (Vec_Ptr_t *)0x0) {
      free(p->vCos);
      p->vCos = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vObjs != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vObjs->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vObjs->pArray = (void **)0x0;
    }
    if (p->vObjs != (Vec_Ptr_t *)0x0) {
      free(p->vObjs);
      p->vObjs = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vBufs != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vBufs->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vBufs->pArray = (void **)0x0;
    }
    if (p->vBufs != (Vec_Ptr_t *)0x0) {
      free(p->vBufs);
      p->vBufs = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->unfold2_type_I != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->unfold2_type_I->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->unfold2_type_I->pArray = (void **)0x0;
    }
    if (p->unfold2_type_I != (Vec_Ptr_t *)0x0) {
      free(p->unfold2_type_I);
      p->unfold2_type_I = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->unfold2_type_II != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->unfold2_type_II->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->unfold2_type_II->pArray = (void **)0x0;
    }
    if (p->unfold2_type_II != (Vec_Ptr_t *)0x0) {
      free(p->unfold2_type_II);
      p->unfold2_type_II = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vLevelR != (Vec_Int_t *)0x0) {
    piVar3 = p->vLevelR->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vLevelR->pArray = (int *)0x0;
    }
    if (p->vLevelR != (Vec_Int_t *)0x0) {
      free(p->vLevelR);
      p->vLevelR = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = p->vLevels;
  if (pVVar4 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar6];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          free(pvVar1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    free(pVVar4);
    p->vLevels = (Vec_Vec_t *)0x0;
  }
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    piVar3 = p->vFlopNums->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vFlopNums->pArray = (int *)0x0;
    }
    if (p->vFlopNums != (Vec_Int_t *)0x0) {
      free(p->vFlopNums);
      p->vFlopNums = (Vec_Int_t *)0x0;
    }
  }
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    piVar3 = p->vFlopReprs->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vFlopReprs->pArray = (int *)0x0;
    }
    if (p->vFlopReprs != (Vec_Int_t *)0x0) {
      free(p->vFlopReprs);
      p->vFlopReprs = (Vec_Int_t *)0x0;
    }
  }
  pVVar5 = p->vOnehots;
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar6];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          free(pvVar1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    free(pVVar5);
    p->vOnehots = (Vec_Ptr_t *)0x0;
  }
  pVVar4 = p->vClockDoms;
  if (pVVar4 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar6];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          free(pvVar1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    free(pVVar4);
    p->vClockDoms = (Vec_Vec_t *)0x0;
  }
  if (p->vProbs != (Vec_Int_t *)0x0) {
    piVar3 = p->vProbs->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vProbs->pArray = (int *)0x0;
    }
    if (p->vProbs != (Vec_Int_t *)0x0) {
      free(p->vProbs);
      p->vProbs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCiNumsOrig != (Vec_Int_t *)0x0) {
    piVar3 = p->vCiNumsOrig->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vCiNumsOrig->pArray = (int *)0x0;
    }
    if (p->vCiNumsOrig != (Vec_Int_t *)0x0) {
      free(p->vCiNumsOrig);
      p->vCiNumsOrig = (Vec_Int_t *)0x0;
    }
  }
  if (p->vMapped != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vMapped->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vMapped->pArray = (void **)0x0;
    }
    if (p->vMapped != (Vec_Ptr_t *)0x0) {
      free(p->vMapped);
      p->vMapped = (Vec_Ptr_t *)0x0;
    }
  }
  pVVar5 = p->vSeqModelVec;
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < pVVar5->pArray[lVar6]) {
          free(pVVar5->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    free(pVVar5);
  }
  if (p->pTerSimData != (uint *)0x0) {
    free(p->pTerSimData);
    p->pTerSimData = (uint *)0x0;
  }
  if (p->pFastSim != (int *)0x0) {
    free(p->pFastSim);
    p->pFastSim = (int *)0x0;
  }
  if (p->pData != (void *)0x0) {
    free(p->pData);
    p->pData = (void *)0x0;
  }
  if (p->pSeqModel != (Abc_Cex_t *)0x0) {
    free(p->pSeqModel);
    p->pSeqModel = (Abc_Cex_t *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->pObjCopies != (Aig_Obj_t **)0x0) {
    free(p->pObjCopies);
    p->pObjCopies = (Aig_Obj_t **)0x0;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    free(p->pReprs);
    p->pReprs = (Aig_Obj_t **)0x0;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    free(p->pEquivs);
    p->pEquivs = (Aig_Obj_t **)0x0;
  }
  if (p->pTable != (Aig_Obj_t **)0x0) {
    free(p->pTable);
    p->pTable = (Aig_Obj_t **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Aig_ManStop( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
    // make sure the nodes have clean marks
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    if ( p->pFanData ) 
        Aig_ManFanoutStop( p );
    if ( p->pManExdc )  
        Aig_ManStop( p->pManExdc );
//    Aig_TableProfile( p );
    Aig_MmFixedStop( p->pMemObjs, 0 );
    Vec_PtrFreeP( &p->vCis );
    Vec_PtrFreeP( &p->vCos );
    Vec_PtrFreeP( &p->vObjs );
    Vec_PtrFreeP( &p->vBufs );
    //--jlong -- begin
    Vec_PtrFreeP( &p->unfold2_type_I );
    Vec_PtrFreeP( &p->unfold2_type_II );
    //--jlong -- end
    Vec_IntFreeP( &p->vLevelR );
    Vec_VecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vFlopNums );
    Vec_IntFreeP( &p->vFlopReprs );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vOnehots );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vProbs );
    Vec_IntFreeP( &p->vCiNumsOrig );
    Vec_PtrFreeP( &p->vMapped );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    ABC_FREE( p->pTerSimData );
    ABC_FREE( p->pFastSim );
    ABC_FREE( p->pData );
    ABC_FREE( p->pSeqModel );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pObjCopies );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pEquivs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}